

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *unaff_R14;
  char *unaff_R15;
  char *damagebinFileName;
  char *local_d0;
  sigaction sa;
  
  progname = *argv;
  while( true ) {
    while (damagebinFileName = unaff_R15, iVar1 = getopt(argc,argv,":d:f:s:vh"), iVar1 == 0x3a) {
      fwrite("option needs a value\n",0x15,1,_stderr);
      unaff_R15 = damagebinFileName;
    }
    if (iVar1 == -1) break;
    unaff_R15 = _optarg;
    if (iVar1 != 100) {
      if (iVar1 == 0x66) {
        local_d0 = _optarg;
        unaff_R15 = damagebinFileName;
      }
      else {
        unaff_R14 = _optarg;
        unaff_R15 = damagebinFileName;
        if (iVar1 != 0x73) {
          if (iVar1 == 0x76) {
            fprintf(_stderr,"%s: version: %s\n",*argv,"");
          }
          else {
            help();
          }
          exit(1);
        }
      }
    }
  }
  memset(&sa,0,0x98);
  sigemptyset((sigset_t *)&sa.sa_mask);
  sa.__sigaction_handler.sa_handler = segfault_sigaction;
  sa.sa_flags = 4;
  sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
  crossvalidation::doit(damagebinFileName,local_d0,unaff_R14);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

  progname = argv[0];
  char *damagebinFileName;
  char *footprintFileName;
  char *vulnerabilityFileName;
  int opt;
  while((opt = getopt(argc, argv, ":d:f:s:vh")) != -1) {
    switch(opt) {
      case 'd':
	damagebinFileName = optarg;
	break;
      case 'f':
	footprintFileName = optarg;
	break;
      case 's':
	vulnerabilityFileName = optarg;
	break;
      case ':':
	fprintf(stderr, "option needs a value\n");
	break;
      case 'v':
	fprintf(stderr, "%s: version: %s\n", argv[0], VERSION);
	exit(EXIT_FAILURE);
	break;
      case 'h':
      default:
	help();
	exit(EXIT_FAILURE);
    }
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = segfault_sigaction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {
    crossvalidation::doit(damagebinFileName, footprintFileName,
		    	vulnerabilityFileName);
    return 0;
  }
  catch(std::bad_alloc&) {
    fprintf(stderr, "%s: Memory allocation failed.\n", progname);
    exit(0);
  }

}